

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

ON__UINT32 __thiscall ON_WindingNumber::AddBoundary(ON_WindingNumber *this,ON_2dPoint p)

{
  ON__UINT32 OVar1;
  double local_20;
  double dStack_18;
  
  dStack_18 = p.y;
  local_20 = p.x;
  OVar1 = this->m_boundary_segment_count;
  if (!NAN((this->m_winding_point).x)) {
    if (NAN((this->m_prev_boundary_point).x)) {
      (this->m_prev_boundary_point).x = local_20;
      (this->m_prev_boundary_point).y = dStack_18;
    }
    else {
      Internal_AddBoundarySegment(this,&(this->m_prev_boundary_point).x,&local_20);
    }
  }
  return this->m_boundary_segment_count - OVar1;
}

Assistant:

ON__UINT32 ON_WindingNumber::AddBoundary(ON_2dPoint p)
{
  const ON__UINT32 boundary_segment_count0 = m_boundary_segment_count;
  if (Internal_HaveWindingPoint())
  {
    if ( m_prev_boundary_point.x == m_prev_boundary_point.x )
      Internal_AddBoundarySegment(&m_prev_boundary_point.x, &p.x);
    else 
      m_prev_boundary_point = p;
  }
  return (m_boundary_segment_count - boundary_segment_count0);
}